

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

span<const_slang::ast::Expression_*const,_18446744073709551615UL> __thiscall
slang::ast::createUninstantiatedParams
          (ast *this,HierarchyInstantiationSyntax *syntax,ASTContext *context)

{
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar1;
  int iVar2;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  ASTContext *extraout_RDX;
  ASTContext *extraout_RDX_00;
  ASTContext *extraout_RDX_01;
  __extent_storage<18446744073709551615UL> extraout_RDX_02;
  ulong uVar4;
  long lVar5;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> sVar6;
  SmallVector<const_slang::ast::Expression_*,_5UL> params;
  Expression *local_78;
  SmallVectorBase<const_slang::ast::Expression_*> local_70 [2];
  
  local_70[0].data_ = (pointer)local_70[0].firstElement;
  local_70[0].len = 0;
  local_70[0].cap = 5;
  if ((this != (ast *)0x0) && (1 < *(long *)(this + 0x68) + 1U)) {
    uVar4 = *(long *)(this + 0x68) + 1U >> 1;
    lVar5 = 0;
    do {
      ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           (*(long *)(this + 0x60) + lVar5));
      pSVar1 = *ppSVar3;
      context = extraout_RDX;
      if (pSVar1->kind == NamedParamAssignment) {
        if (*(long *)(pSVar1 + 3) != 0) {
          iVar2 = Expression::bind((int)*(long *)(pSVar1 + 3),(sockaddr *)syntax,4);
          local_78 = (Expression *)CONCAT44(extraout_var_00,iVar2);
          SmallVectorBase<slang::ast::Expression_const*>::
          emplace_back<slang::ast::Expression_const*>
                    ((SmallVectorBase<slang::ast::Expression_const*> *)local_70,&local_78);
          context = extraout_RDX_01;
        }
      }
      else if (pSVar1->kind == OrderedParamAssignment) {
        iVar2 = Expression::bind((int)*(undefined8 *)(pSVar1 + 1),(sockaddr *)syntax,0);
        local_78 = (Expression *)CONCAT44(extraout_var,iVar2);
        SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                  ((SmallVectorBase<slang::ast::Expression_const*> *)local_70,&local_78);
        context = extraout_RDX_00;
      }
      lVar5 = lVar5 + 0x30;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  sVar6._M_ptr._0_4_ =
       SmallVectorBase<const_slang::ast::Expression_*>::copy
                 (local_70,(EVP_PKEY_CTX *)
                           **(undefined8 **)&(syntax->super_MemberSyntax).super_SyntaxNode,
                  (EVP_PKEY_CTX *)context);
  sVar6._M_ptr._4_4_ = extraout_var_01;
  if (local_70[0].data_ != (pointer)local_70[0].firstElement) {
    operator_delete(local_70[0].data_);
  }
  sVar6._M_extent._M_extent_value = extraout_RDX_02._M_extent_value;
  return sVar6;
}

Assistant:

static std::span<const Expression* const> createUninstantiatedParams(
    const HierarchyInstantiationSyntax& syntax, const ASTContext& context) {

    SmallVector<const Expression*> params;
    if (syntax.parameters) {
        for (auto expr : syntax.parameters->parameters) {
            // Empty expressions are just ignored here.
            if (expr->kind == SyntaxKind::OrderedParamAssignment) {
                params.push_back(
                    &Expression::bind(*expr->as<OrderedParamAssignmentSyntax>().expr, context));
            }
            else if (expr->kind == SyntaxKind::NamedParamAssignment) {
                if (auto ex = expr->as<NamedParamAssignmentSyntax>().expr)
                    params.push_back(&Expression::bind(*ex, context, ASTFlags::AllowDataType));
            }
        }
    }

    return params.copy(context.getCompilation());
}